

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.c
# Opt level: O2

lzma_index * lzma_index_init(lzma_allocator *allocator)

{
  lzma_index *tree;
  index_stream *node;
  
  tree = index_init_plain(allocator);
  if (tree != (lzma_index *)0x0) {
    node = index_stream_init(0,0,1,0,allocator);
    if (node != (index_stream *)0x0) {
      index_tree_append(&tree->streams,&node->node);
      return tree;
    }
    lzma_free(tree,allocator);
  }
  return (lzma_index *)0x0;
}

Assistant:

extern LZMA_API(lzma_index *)
lzma_index_init(lzma_allocator *allocator)
{
	index_stream *s;

	lzma_index *i = index_init_plain(allocator);
	if (i == NULL)
		return NULL;

	s = index_stream_init(0, 0, 1, 0, allocator);
	if (s == NULL) {
		lzma_free(i, allocator);
		return NULL;
	}

	index_tree_append(&i->streams, &s->node);

	return i;
}